

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditersol.c
# Opt level: O3

void dpsolve(int n,double *x,double *y)

{
  char equed [1];
  int_t info;
  double rcond;
  double rpg;
  
  equed[0] = 'N';
  dpsolve::XX.nrow = n;
  dpsolve::YY.nrow = n;
  dpsolve::X.lda = n;
  dpsolve::X.nzval = x;
  dpsolve::Y.lda = n;
  dpsolve::Y.nzval = y;
  dgsisx(GLOBAL_OPTIONS,GLOBAL_A,GLOBAL_PERM_C,GLOBAL_PERM_R,(int *)0x0,equed,GLOBAL_R,GLOBAL_C,
         GLOBAL_L,GLOBAL_U,(void *)0x0,0,&dpsolve::YY,&dpsolve::XX,&rpg,&rcond,(GlobalLU_t *)0x0,
         GLOBAL_MEM_USAGE,GLOBAL_STAT,&info);
  return;
}

Assistant:

void dpsolve(int n, double x[], double y[])
{
    SuperMatrix *A = GLOBAL_A, *L = GLOBAL_L, *U = GLOBAL_U;
    SuperLUStat_t *stat = GLOBAL_STAT;
    int *perm_c = GLOBAL_PERM_C, *perm_r = GLOBAL_PERM_R;
    char equed[1] = {'N'};
    double *R = GLOBAL_R, *C = GLOBAL_C;
    superlu_options_t *options = GLOBAL_OPTIONS;
    mem_usage_t  *mem_usage = GLOBAL_MEM_USAGE;
    int_t info;
    static DNformat X, Y;
    static SuperMatrix XX = {SLU_DN, SLU_D, SLU_GE, 1, 1, &X};
    static SuperMatrix YY = {SLU_DN, SLU_D, SLU_GE, 1, 1, &Y};
    double rpg, rcond;

    XX.nrow = YY.nrow = n;
    X.lda = Y.lda = n;
    X.nzval = x;
    Y.nzval = y;

#if 0
    dcopy_(&n, y, &i_1, x, &i_1);
    dgstrs(NOTRANS, L, U, perm_c, perm_r, &XX, stat, &info);
#else
    dgsisx(options, A, perm_c, perm_r, NULL, equed, R, C,
	   L, U, NULL, 0, &YY, &XX, &rpg, &rcond, NULL,
	   mem_usage, stat, &info);
#endif
}